

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
* __thiscall
Lib::
OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
::operator=(OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
            *this,OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
                  *other)

{
  Literal *pLVar1;
  uint64_t uVar2;
  bool bVar3;
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
  local_18;
  
  if (this->_isSome == true) {
    VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
    ::~VirtualIterator(&(this->_elem)._elem.init._inner);
  }
  bVar3 = other->_isSome;
  if (bVar3 == true) {
    pLVar1 = (other->_elem)._elem.init._func._c.first;
    uVar2 = (other->_elem)._elem.init._func._c.second._content;
    local_18._core =
         *(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
           **)((long)&(other->_elem)._elem + 0x10);
    if (local_18._core ==
        (IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
         *)0x0) {
      uVar2 = (other->_elem)._elem.init._func._c.second._content;
      (this->_elem)._elem.init._func._c.first = (other->_elem)._elem.init._func._c.first;
      (this->_elem)._elem.init._func._c.second._content = uVar2;
    }
    else {
      (local_18._core)->_refCnt = (local_18._core)->_refCnt + 1;
      (this->_elem)._elem.init._func._c.first = pLVar1;
      (this->_elem)._elem.init._func._c.second._content = uVar2;
      (local_18._core)->_refCnt = (local_18._core)->_refCnt + 1;
    }
    (this->_elem)._elem.init._inner._core = local_18._core;
    VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
    ::~VirtualIterator(&local_18);
    bVar3 = other->_isSome;
  }
  this->_isSome = bVar3;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }